

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::CSMImporter::CanRead(CSMImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  char *tokens [1];
  string extension;
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"csm");
  bVar2 = true;
  if (!bVar1) {
    if (checkSig) {
      if (pIOHandler == (IOSystem *)0x0) {
        bVar2 = false;
        goto LAB_003fdeb3;
      }
    }
    else {
      bVar2 = false;
      if ((pIOHandler == (IOSystem *)0x0) || (extension._M_string_length != 0)) goto LAB_003fdeb3;
    }
    tokens[0] = "$Filename";
    bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
  }
LAB_003fdeb3:
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool CSMImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    // check file extension
    const std::string extension = GetExtension(pFile);

    if( extension == "csm")
        return true;

    if ((checkSig || !extension.length()) && pIOHandler) {
        const char* tokens[] = {"$Filename"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}